

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_stepper.cpp
# Opt level: O2

void QtMWidgets::Stepper::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  QColor *pQVar5;
  Spec val;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      valueChanged((Stepper *)_o,*_a[1]);
      return;
    case 1:
      val = *_a[1];
LAB_00167b04:
      setValue((Stepper *)_o,val);
      return;
    case 2:
      stepDown((Stepper *)_o);
      return;
    case 3:
      stepUp((Stepper *)_o);
      return;
    case 4:
      _q_autorepeat((Stepper *)_o);
      return;
    }
    break;
  case ReadProperty:
    if (6 < (uint)_id) {
      return;
    }
    piVar1 = (int *)*_a;
    switch(_id) {
    case 0:
      iVar4 = maximum((Stepper *)_o);
      break;
    case 1:
      iVar4 = minimum((Stepper *)_o);
      break;
    case 2:
      iVar4 = singleStep((Stepper *)_o);
      break;
    case 3:
      iVar4 = value((Stepper *)_o);
      break;
    case 4:
      bVar3 = wrapping((Stepper *)_o);
      goto LAB_00167b44;
    case 5:
      bVar3 = autorepeat((Stepper *)_o);
LAB_00167b44:
      *(bool *)piVar1 = bVar3;
      return;
    case 6:
      pQVar5 = color((Stepper *)_o);
      uVar2 = *(undefined8 *)((long)&pQVar5->ct + 2);
      *(undefined8 *)piVar1 = *(undefined8 *)pQVar5;
      *(undefined8 *)((long)piVar1 + 6) = uVar2;
      return;
    }
    *piVar1 = iVar4;
    break;
  case WriteProperty:
    if ((uint)_id < 7) {
      pQVar5 = (QColor *)*_a;
      switch(_id) {
      case 0:
        setMaximum((Stepper *)_o,pQVar5->cspec);
        return;
      case 1:
        setMinimum((Stepper *)_o,pQVar5->cspec);
        return;
      case 2:
        setSingleStep((Stepper *)_o,pQVar5->cspec);
        return;
      case 3:
        val = pQVar5->cspec;
        break;
      case 4:
        setWrapping((Stepper *)_o,SUB41(pQVar5->cspec,0));
        return;
      case 5:
        setAutorepeat((Stepper *)_o,SUB41(pQVar5->cspec,0));
        return;
      case 6:
        setColor((Stepper *)_o,pQVar5);
        return;
      }
      goto LAB_00167b04;
    }
    break;
  case IndexOfMethod:
    if ((*_a[1] == valueChanged) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  return;
}

Assistant:

void QtMWidgets::Stepper::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Stepper *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->valueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->setValue((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->stepDown(); break;
        case 3: _t->stepUp(); break;
        case 4: _t->_q_autorepeat(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Stepper::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Stepper::valueChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Stepper *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->maximum(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->minimum(); break;
        case 2: *reinterpret_cast< int*>(_v) = _t->singleStep(); break;
        case 3: *reinterpret_cast< int*>(_v) = _t->value(); break;
        case 4: *reinterpret_cast< bool*>(_v) = _t->wrapping(); break;
        case 5: *reinterpret_cast< bool*>(_v) = _t->autorepeat(); break;
        case 6: *reinterpret_cast< QColor*>(_v) = _t->color(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Stepper *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setMaximum(*reinterpret_cast< int*>(_v)); break;
        case 1: _t->setMinimum(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setSingleStep(*reinterpret_cast< int*>(_v)); break;
        case 3: _t->setValue(*reinterpret_cast< int*>(_v)); break;
        case 4: _t->setWrapping(*reinterpret_cast< bool*>(_v)); break;
        case 5: _t->setAutorepeat(*reinterpret_cast< bool*>(_v)); break;
        case 6: _t->setColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}